

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O0

void __thiscall
kj::StringTree::flattenTo::anon_class_16_2_77190bd5::operator()
          (anon_class_16_2_77190bd5 *this,ArrayPtr<const_char> text)

{
  char *__dest;
  char *__src;
  long local_38;
  size_t local_30;
  size_t local_28;
  size_t size;
  anon_class_16_2_77190bd5 *this_local;
  ArrayPtr<const_char> text_local;
  
  text_local.ptr = (char *)text.size_;
  this_local = (anon_class_16_2_77190bd5 *)text.ptr;
  size = (size_t)this;
  local_30 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  local_38 = (long)this->limit - (long)*this->target;
  local_28 = min<unsigned_long,long>(&local_30,&local_38);
  __dest = *this->target;
  __src = ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&this_local);
  memcpy(__dest,__src,local_28);
  *this->target = *this->target + local_28;
  return;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target, char* limit) const {
  visit([&target,limit](ArrayPtr<const char> text) {
    size_t size = kj::min(text.size(), limit - target);
    memcpy(target, text.begin(), size);
    target += size;
  });
  return target;
}